

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O0

EulerAngles * __thiscall
KDIS::DATA_TYPE::EulerAngles::operator-
          (EulerAngles *__return_storage_ptr__,EulerAngles *this,EulerAngles *Value)

{
  EulerAngles *Value_local;
  EulerAngles *this_local;
  EulerAngles *tmp;
  
  EulerAngles(__return_storage_ptr__,this);
  __return_storage_ptr__->m_f32Psi =
       (KFLOAT32)((float)__return_storage_ptr__->m_f32Psi - (float)Value->m_f32Psi);
  __return_storage_ptr__->m_f32Theta =
       (KFLOAT32)((float)__return_storage_ptr__->m_f32Theta - (float)Value->m_f32Theta);
  __return_storage_ptr__->m_f32Phi =
       (KFLOAT32)((float)__return_storage_ptr__->m_f32Phi - (float)Value->m_f32Phi);
  return __return_storage_ptr__;
}

Assistant:

EulerAngles EulerAngles::operator - ( const EulerAngles & Value ) const
{
    EulerAngles tmp = *this;
    tmp.m_f32Psi   -= Value.m_f32Psi;
    tmp.m_f32Theta -= Value.m_f32Theta;
    tmp.m_f32Phi   -= Value.m_f32Phi;
    return tmp;
}